

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void BenchmarkFunc<TSlowLog,double>
               (vector<double_*,_std::allocator<double_*>_> *inVectors,
               vector<double_*,_std::allocator<double_*>_> *outVectors,size_t vecSize,size_t nIter,
               string *name)

{
  ulong uVar1;
  size_type sVar2;
  runtime_error *this;
  ostream *poVar3;
  reference pvVar4;
  void *this_00;
  ulong in_RCX;
  vector<double_*,_std::allocator<double_*>_> *in_RSI;
  vector<double_*,_std::allocator<double_*>_> *in_RDI;
  string *in_R8;
  duration<double,_std::ratio<1L,_1L>_> timeSpan;
  value_type *outV;
  value_type *inV;
  size_t vecIdx;
  size_t iterIdx;
  vector<double,_std::allocator<double>_> times;
  time_point t;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff28;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff30;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  duration<double,_std::ratio<1L,_1L>_> local_88 [3];
  reference local_70;
  const_reference local_68;
  ulong local_60;
  undefined8 local_58;
  ulong local_50;
  vector<double,_std::allocator<double>_> local_48;
  undefined8 local_30;
  string *local_28;
  ulong local_20;
  vector<double_*,_std::allocator<double_*>_> *local_10;
  vector<double_*,_std::allocator<double_*>_> *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffff20);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x127f39);
  local_50 = 0;
  do {
    if (local_20 <= local_50) {
      __first._M_current = (double *)&local_48;
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
      std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (__first,in_stack_ffffffffffffff28);
      poVar3 = std::operator<<((ostream *)&std::cerr,local_28);
      poVar3 = std::operator<<(poVar3,": ");
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,0);
      this_00 = (void *)std::ostream::operator<<(poVar3,*pvVar4);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)__first._M_current);
      return;
    }
    local_58 = std::chrono::_V2::system_clock::now();
    local_60 = 0;
    local_30 = local_58;
    while( true ) {
      uVar1 = local_60;
      sVar2 = std::vector<double_*,_std::allocator<double_*>_>::size(local_8);
      if (sVar2 <= uVar1) break;
      local_68 = std::vector<double_*,_std::allocator<double_*>_>::operator[](local_8,local_60);
      local_70 = std::vector<double_*,_std::allocator<double_*>_>::operator[](local_10,local_60);
      TSlowLog::Apply<double>
                (&in_stack_ffffffffffffff30->__r,(size_t)in_stack_ffffffffffffff28._M_current,
                 (double *)in_stack_ffffffffffffff20);
      if (*local_70 != (value_type)0x0) {
        if ((**local_70 == 43432432.0) && (!NAN(**local_70))) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"requirement outV[0] != 43432432 failed");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      local_60 = local_60 + 1;
    }
    std::chrono::_V2::system_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffff28._M_current,
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffff20);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              (in_stack_ffffffffffffff30,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff28._M_current)
    ;
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_88);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff20,(value_type_conflict1 *)in_stack_ffffffffffffff18);
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

void BenchmarkFunc(const std::vector<T*>& inVectors, std::vector<T*>& outVectors,
                   size_t vecSize, size_t nIter, const std::string& name) {
    std::chrono::high_resolution_clock::time_point t;
    std::vector<double> times;
    for (size_t iterIdx = 0; iterIdx < nIter; ++iterIdx) {
        t = std::chrono::high_resolution_clock::now();
        (void)(iterIdx);
        for (size_t vecIdx = 0; vecIdx < inVectors.size(); ++vecIdx) {
            auto& inV = inVectors[vecIdx];
            auto& outV = outVectors[vecIdx];
            TFunc::Apply(inV, vecSize, outV);
            if (outV && outV[0] == 43432432) {
                throw std::runtime_error("requirement outV[0] != 43432432 failed");
            }
        }
        std::chrono::duration<double> timeSpan = std::chrono::high_resolution_clock::now() - t;
        times.push_back(timeSpan.count());
    }
    std::sort(times.begin(), times.end());
    std::cerr << name << ": " << times[0] << std::endl;
}